

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

bool __thiscall helics::InputInfo::updateData(InputInfo *this,dataRecord *update,int index)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  pointer psVar9;
  SmallBuffer *__tmp;
  
  if (this->only_update_on_change == true) {
    psVar9 = (this->current_data).
             super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = psVar9[index].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_0031f4b7;
    peVar2 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __n = peVar1->bufferSize;
    if ((__n == peVar2->bufferSize) &&
       ((__n == 0 || (iVar7 = bcmp(peVar1->heap,peVar2->heap,__n), iVar7 == 0)))) {
      ppVar5 = (this->current_data_time).
               super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar5[index].first.internalTimeCode != (update->time).internalTimeCode) {
        return false;
      }
      uVar8 = update->iteration;
      bVar6 = false;
      goto LAB_0031f4f8;
    }
    psVar9 = psVar9 + index;
    p_Var3 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar9->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar2;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (psVar9->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (psVar9->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = p_Var3;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    uVar8 = update->iteration;
    ppVar5 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  else {
LAB_0031f4b7:
    psVar9 = (this->current_data).
             super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             psVar9[index].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    psVar9 = psVar9 + index;
    (psVar9->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar1;
    (psVar9->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = p_Var3;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    uVar8 = update->iteration;
    ppVar5 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  bVar6 = true;
LAB_0031f4f8:
  ppVar5[index].second = uVar8;
  return bVar6;
}

Assistant:

bool InputInfo::updateData(dataRecord&& update, int index)
{
    if (!only_update_on_change || !current_data[index]) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }

    if (*current_data[index] != *(update.data)) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }
    if (current_data_time[index].first == update.time) {
        // this is for bookkeeping purposes should still return false
        current_data_time[index].second = update.iteration;
    }
    return false;
}